

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_fxxx_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(*quads) {
  case 0:
    sh4asm_txt_fadd_frm_frn(em,quads[1],quads[2]);
    break;
  case 1:
    sh4asm_txt_fsub_frm_frn(em,quads[1],quads[2]);
    break;
  case 2:
    sh4asm_txt_fmul_frm_frn(em,quads[1],quads[2]);
    break;
  case 3:
    sh4asm_txt_fdiv_frm_frn(em,quads[1],quads[2]);
    break;
  case 4:
    sh4asm_txt_fcmpeq_frm_frn(em,quads[1],quads[2]);
    break;
  case 5:
    sh4asm_txt_fcmpgt_frm_frn(em,quads[1],quads[2]);
    break;
  case 6:
    sh4asm_txt_fmovs_a_r0_rm_frn(em,quads[1],quads[2]);
    break;
  case 7:
    sh4asm_txt_fmovs_frm_a_r0_rn(em,quads[1],quads[2]);
    break;
  case 8:
    sh4asm_txt_fmovs_arm_frn(em,quads[1],quads[2]);
    break;
  case 9:
    sh4asm_txt_fmovs_armp_frn(em,quads[1],quads[2]);
    break;
  case 10:
    sh4asm_txt_fmovs_frm_arn(em,quads[1],quads[2]);
    break;
  case 0xb:
    sh4asm_txt_fmovs_frm_amrn(em,quads[1],quads[2]);
    break;
  case 0xc:
    sh4asm_txt_fmov_frm_frn(em,quads[1],quads[2]);
    break;
  case 0xd:
    sh4asm_disas_fxxd_(quads,em,pc);
    break;
  case 0xe:
    sh4asm_txt_fmac_fr0_frm_frn(em,quads[1],quads[2]);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_fxxx_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[0]) {
    case 0:
        // mask is f00f
        // alternatively, the mask is f11f for the double-precision version
        sh4asm_txt_fadd_frm_frn(em, quads[1], quads[2]);
        break;
    case 1:
        // mask is f00f
        // alternatively, the mask is f11f for the double-precision version
        sh4asm_txt_fsub_frm_frn(em, quads[1], quads[2]);
        break;
    case 2:
        // mask is f00f
        // alternatively, the mask is f11f for the double-precision version
        sh4asm_txt_fmul_frm_frn(em, quads[1], quads[2]);
        break;
    case 3:
        // mask is f00f
        // alternatively, the mask is f11f for the double-precision version
        sh4asm_txt_fdiv_frm_frn(em, quads[1], quads[2]);
        break;
    case 4:
        // mask is f00f
        // alternatively, the mask is f11f for the double-precision version
        sh4asm_txt_fcmpeq_frm_frn(em, quads[1], quads[2]);
        break;
    case 5:
        // mask is f00f
        // alternatively, the mask is f11f for the double-precision version
        sh4asm_txt_fcmpgt_frm_frn(em, quads[1], quads[2]);
        break;
    case 6:
        // mask is f00f
        // alternatively, the mask is f10f for the double-precision version
        sh4asm_txt_fmovs_a_r0_rm_frn(em, quads[1], quads[2]);
        break;
    case 7:
        // mask is f00f
        // alternatively, the mask is f01f for the double-precision version
        sh4asm_txt_fmovs_frm_a_r0_rn(em, quads[1], quads[2]);
        break;
    case 8:
        // mask is f00f
        // alternatively, the mask is f10f for the double-precision versions
        sh4asm_txt_fmovs_arm_frn(em, quads[1], quads[2]);
        break;
    case 9:
        // mask is f00f
        // alternatively, the mask is f10f for the double-precision versions
        sh4asm_txt_fmovs_armp_frn(em, quads[1], quads[2]);
        break;
    case 10:
        // mask is f00f
        // alternatively, the mask is f01f for the double-precision version
        sh4asm_txt_fmovs_frm_arn(em, quads[1], quads[2]);
        break;
    case 11:
        // mask is f00f
        // alternatively, the mask is f01f for the double-precision version
        sh4asm_txt_fmovs_frm_amrn(em, quads[1], quads[2]);
        break;
    case 12:
        // mask is f00f
        // alternatively, the mask is f11f for the double-precision version
        sh4asm_txt_fmov_frm_frn(em, quads[1], quads[2]);
        break;
    case 13:
        sh4asm_disas_fxxd_(quads, em, pc);
        break;
    case 14:
        // mask is f00f
        sh4asm_txt_fmac_fr0_frm_frn(em, quads[1], quads[2]);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}